

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O2

void __thiscall
nonstd::span_lite::detail::contract_violation::contract_violation
          (contract_violation *this,char *message)

{
  allocator local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,message,&local_31);
  std::logic_error::logic_error(&this->super_logic_error,local_30);
  std::__cxx11::string::_M_dispose();
  *(undefined ***)this = &PTR__logic_error_0018bc70;
  return;
}

Assistant:

explicit contract_violation( char const * const message )
        : std::logic_error( message )
    {}